

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_rate.c
# Opt level: O3

double * inform_local_entropy_rate
                   (int *series,size_t n,size_t m,int b,size_t k,double *er,inform_error *err)

{
  int *piVar1;
  int *piVar2;
  _Bool _Var3;
  double *__ptr;
  ulong uVar4;
  double *__ptr_00;
  void *__ptr_01;
  size_t sVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  void *pvVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  size_t l;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  
  _Var3 = check_arguments(series,n,m,b,k,err);
  if (_Var3) {
    return (double *)0x0;
  }
  lVar8 = (m - k) * n;
  __ptr = er;
  if ((er != (double *)0x0) || (__ptr = (double *)malloc(lVar8 * 8), __ptr != (double *)0x0)) {
    auVar16._8_4_ = (int)(k >> 0x20);
    auVar16._0_8_ = k;
    auVar16._12_4_ = 0x45300000;
    dVar15 = pow((double)b,
                 (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar15 = dVar15 * (double)b;
    uVar4 = (ulong)dVar15;
    uVar4 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    __ptr_00 = (double *)calloc(uVar4 / (ulong)(long)b + uVar4,4);
    if (__ptr_00 == (double *)0x0) {
      __ptr_00 = __ptr;
      if (er != (double *)0x0) goto LAB_00104419;
    }
    else {
      __ptr_01 = malloc(lVar8 * 0x10);
      if (__ptr_01 != (void *)0x0) {
        if (n != 0) {
          piVar1 = (int *)((long)__ptr_01 + lVar8 * 4);
          piVar7 = series + k;
          sVar9 = 0;
          pvVar10 = __ptr_01;
          piVar11 = piVar1;
          do {
            *piVar11 = 0;
            iVar12 = 1;
            if (k != 0) {
              iVar13 = 0;
              sVar5 = 0;
              do {
                iVar12 = iVar12 * b;
                iVar13 = iVar13 * b + series[sVar5];
                sVar5 = sVar5 + 1;
              } while (k != sVar5);
              *piVar11 = iVar13;
            }
            if (k < m) {
              lVar14 = 0;
              while( true ) {
                lVar6 = (long)piVar7[lVar14] + (long)piVar11[lVar14] * (long)b;
                iVar13 = (int)lVar6;
                *(int *)((long)pvVar10 + lVar14 * 4) = iVar13;
                piVar2 = (int *)((long)__ptr_00 + lVar6 * 4);
                *piVar2 = *piVar2 + 1;
                piVar2 = (int *)((long)__ptr_00 + (long)piVar11[lVar14] * 4 + uVar4 * 4);
                *piVar2 = *piVar2 + 1;
                if (~k + m == lVar14) break;
                piVar11[lVar14 + 1] = iVar13 - series[lVar14] * iVar12;
                lVar14 = lVar14 + 1;
              }
            }
            piVar11 = piVar11 + (m - k);
            sVar9 = sVar9 + 1;
            series = series + m;
            piVar7 = piVar7 + m;
            pvVar10 = (void *)((long)pvVar10 + m * 4 + k * -4);
          } while (sVar9 != n);
          if (lVar8 != 0) {
            lVar14 = 0;
            do {
              dVar15 = log2((double)*(uint *)((long)__ptr_00 + (long)piVar1[lVar14] * 4 + uVar4 * 4)
                            / (double)*(uint *)((long)__ptr_00 +
                                               (long)*(int *)((long)__ptr_01 + lVar14 * 4) * 4));
              __ptr[lVar14] = dVar15;
              lVar14 = lVar14 + 1;
            } while (lVar8 != lVar14);
          }
        }
        free(__ptr_01);
        free(__ptr_00);
        return __ptr;
      }
      if (er == (double *)0x0) {
        free(__ptr);
      }
    }
    free(__ptr_00);
  }
LAB_00104419:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_entropy_rate(int const *series, size_t n, size_t m, int b,
    size_t k, double *er, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate_er = (er == NULL);
    if (allocate_er)
    {
        er = malloc(N * sizeof(double));
        if (er == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) (b * pow((double) b, (double) k));
    size_t const histories_size = states_size / b;
    size_t const total_size = states_size + histories_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_er) free(er);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };


    int *state_data = malloc(2 * N * sizeof(uint64_t));
    if (state_data == NULL)
    {
        if (allocate_er) free(er);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state = state_data;
    int *history = state + N;

    accumulate_local_observations(series, n, m, b, k, &states, &histories,
        state, history);

    double s, h;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        h = histories.histogram[history[i]];
        er[i] = log2(h/s);
    }

    free(state_data);
    free(histogram_data);

    return er;
}